

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f Quat4f::cubicInterpolate(Quat4f *q0,Quat4f *q1,Quat4f *q2,Quat4f *q3,float t)

{
  Quat4f *in_R8;
  undefined4 in_XMM0_Da;
  Quat4f QVar1;
  Quat4f q1q2_q2q3;
  Quat4f q0q1_q1q2;
  Quat4f q2q3;
  Quat4f q1q2;
  Quat4f q0q1;
  bool in_stack_ffffffffffffffcb;
  float in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
        in_stack_ffffffffffffffcb);
  slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
        in_stack_ffffffffffffffcb);
  slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
        in_stack_ffffffffffffffcb);
  slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
        in_stack_ffffffffffffffcb);
  slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
        in_stack_ffffffffffffffcb);
  QVar1 = slerp(in_R8,(Quat4f *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffcb);
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::cubicInterpolate( const Quat4f& q0, const Quat4f& q1, const Quat4f& q2, const Quat4f& q3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Quat4f q0q1 = Quat4f::slerp( q0, q1, t + 1 );
	Quat4f q1q2 = Quat4f::slerp( q1, q2, t );
	Quat4f q2q3 = Quat4f::slerp( q2, q3, t - 1 );

	// middle level
	Quat4f q0q1_q1q2 = Quat4f::slerp( q0q1, q1q2, 0.5f * ( t + 1 ) );
	Quat4f q1q2_q2q3 = Quat4f::slerp( q1q2, q2q3, 0.5f * t );

	// top level
	return Quat4f::slerp( q0q1_q1q2, q1q2_q2q3, t );
}